

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall cpptempl::TemplateException::~TemplateException(TemplateException *this)

{
  ~TemplateException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TemplateException(std::string reason) : m_reason(std::move(reason)){}